

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixcomm.c
# Opt level: O1

void wait_for_comm_processes(void)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 in_RAX;
  ssize_t sVar3;
  int *piVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uchar d [6];
  undefined8 local_38;
  
  local_38._1_7_ = (uint7)((ulong)in_RAX >> 8) & 0xffff0000000000;
  local_38 = CONCAT71(local_38._1_7_,0x57);
  write(UnixPipeOut,&local_38,6);
  iVar2 = UnixPipeIn;
  sVar3 = read(UnixPipeIn,&local_38,6);
  if (sVar3 < 0) {
    piVar4 = __errno_location();
    do {
      if ((*piVar4 != 0xb) && (*piVar4 != 4)) {
        perror("reading UnixPipeIn");
        break;
      }
      sVar3 = read(iVar2,&local_38,6);
    } while (sVar3 < 0);
  }
  iVar2 = CONCAT13(local_38._5_1_,
                   CONCAT12(local_38._4_1_,(ushort)local_38 << 8 | (ushort)local_38 >> 8));
  uVar1 = local_38;
  do {
    if (iVar2 == 0) {
      return;
    }
    uVar5 = 0xffffffff;
    if (0 < (long)NPROCS) {
      piVar4 = &UJ->PID;
      lVar7 = 0;
      do {
        if (*piVar4 == iVar2) {
          uVar5 = (uint)lVar7;
          break;
        }
        lVar7 = lVar7 + 1;
        piVar4 = piVar4 + 6;
      } while (NPROCS != lVar7);
    }
    if (-1 < (int)uVar5) {
      local_38._2_1_ = (byte)((ulong)uVar1 >> 0x10);
      local_38._3_1_ = (byte)((ulong)uVar1 >> 0x18);
      uVar6 = (uint)local_38._3_1_;
      if (local_38._2_1_ != 0) {
        uVar6 = (uint)local_38._2_1_ << 8;
      }
      UJ[uVar5].status = uVar6;
    }
    local_38._1_7_ = (uint7)((ulong)uVar1 >> 8) & 0xffff0000000000;
    local_38 = CONCAT71(local_38._1_7_,0x57);
    write(UnixPipeOut,&local_38,6);
    iVar2 = UnixPipeIn;
    sVar3 = read(UnixPipeIn,&local_38,6);
    if (sVar3 < 0) {
      piVar4 = __errno_location();
      do {
        if ((*piVar4 != 0xb) && (*piVar4 != 4)) {
          perror("reading UnixPipeIn");
          break;
        }
        sVar3 = read(iVar2,&local_38,6);
      } while (sVar3 < 0);
    }
    iVar2 = CONCAT13(local_38._5_1_,
                     CONCAT12(local_38._4_1_,(ushort)local_38 << 8 | (ushort)local_38 >> 8));
    uVar1 = local_38;
  } while( true );
}

Assistant:

void wait_for_comm_processes(void) {
  int pid;
  int slot;
  unsigned char d[6];

  memset(d, 0, sizeof(d));
  d[0] = 'W';
  write(UnixPipeOut, d, 6);
  SAFEREAD(UnixPipeIn, d, 6);

  pid = (d[0] << 8) | d[1] | (d[4] << 16) | (d[5] << 24);
  while (pid != 0) {
    slot = find_process_slot(pid);
    /* Ignore processes that we didn't start (shouldn't happen but
       occasionally does) */
    if (slot >= 0) {
      if (d[2] == 0) {
        DBPRINT(("Process %d exited status %d\n", pid, d[3]));
        UJ[slot].status = d[3];
      } else {
        DBPRINT(("Process %d terminated with signal %d\n", pid, d[2]));
        UJ[slot].status = (d[2] << 8);
      }
    }
    /* Look for another stopped process. */
    memset(d, 0, sizeof(d));
    d[0] = 'W';
    write(UnixPipeOut, d, 6);
    SAFEREAD(UnixPipeIn, d, 6);

    pid = (d[0] << 8) | d[1] | (d[4] << 16) | (d[5] << 24);
  }
}